

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O0

void asm_obar(ASMState *as,IRIns *ir)

{
  byte bVar1;
  MCLabel target;
  MCode *pMVar2;
  Reg RVar3;
  Reg val;
  GCobj *vp;
  Reg obj;
  MCLabel l_end;
  IRRef args [2];
  CCallInfo *ci;
  IRIns *ir_local;
  ASMState *as_local;
  
  args[0] = 0x1d8420;
  args[1] = 0;
  ra_evictset(as,0xffff0fc7);
  target = as->mcp;
  l_end._0_4_ = 0x7ffd;
  l_end._4_4_ = (uint)(ir->field_0).op1;
  asm_gencall(as,(CCallInfo *)args,(IRRef *)&l_end);
  RVar3 = ra_releasetmp(as,0x7ffd);
  emit_loadu64(as,RVar3,(uint64_t)&as->J[-1].penalty[0x24].val);
  bVar1 = *(byte *)((long)as->ir + (ulong)(ir->field_0).op1 * 8 + 6);
  emit_sjcc(as,4,target);
  pMVar2 = as->mcp;
  as->mcp = pMVar2 + -1;
  pMVar2[-1] = '\x03';
  if ((ir->field_0).op2 < 0x8000) {
    emit_rma(as,XO_GROUP3b,0,(void *)((long)as->ir[(ulong)(ir->field_0).op2 + 1] + 8));
  }
  else {
    RVar3 = ra_alloc1(as,(uint)(ir->field_0).op2,(1 << (bVar1 & 0x1f) ^ 0xffffffffU) & 0xfc7);
    emit_rmro(as,XO_GROUP3b,0,RVar3,8);
  }
  emit_sjcc(as,4,target);
  pMVar2 = as->mcp;
  as->mcp = pMVar2 + -1;
  pMVar2[-1] = '\x04';
  emit_rmro(as,XO_GROUP3b,0,(uint)bVar1,-8);
  return;
}

Assistant:

static void asm_obar(ASMState *as, IRIns *ir)
{
  const CCallInfo *ci = &lj_ir_callinfo[IRCALL_lj_gc_barrieruv];
  IRRef args[2];
  MCLabel l_end;
  Reg obj;
  /* No need for other object barriers (yet). */
  lj_assertA(IR(ir->op1)->o == IR_UREFC, "bad OBAR type");
  ra_evictset(as, RSET_SCRATCH);
  l_end = emit_label(as);
  args[0] = ASMREF_TMP1;  /* global_State *g */
  args[1] = ir->op1;      /* TValue *tv      */
  asm_gencall(as, ci, args);
  emit_loada(as, ra_releasetmp(as, ASMREF_TMP1), J2G(as->J));
  obj = IR(ir->op1)->r;
  emit_sjcc(as, CC_Z, l_end);
  emit_i8(as, LJ_GC_WHITES);
  if (irref_isk(ir->op2)) {
    GCobj *vp = ir_kgc(IR(ir->op2));
    emit_rma(as, XO_GROUP3b, XOg_TEST, &vp->gch.marked);
  } else {
    Reg val = ra_alloc1(as, ir->op2, rset_exclude(RSET_SCRATCH&RSET_GPR, obj));
    emit_rmro(as, XO_GROUP3b, XOg_TEST, val, (int32_t)offsetof(GChead, marked));
  }
  emit_sjcc(as, CC_Z, l_end);
  emit_i8(as, LJ_GC_BLACK);
  emit_rmro(as, XO_GROUP3b, XOg_TEST, obj,
	    (int32_t)offsetof(GCupval, marked)-(int32_t)offsetof(GCupval, tv));
}